

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O0

CborError qt_cbor_decoder_transfer_string(void *token,void **userptr,size_t offset,size_t len)

{
  enable_if_t<std::is_signed_v<long_long>,_bool> eVar1;
  ulong uVar2;
  ulong in_RCX;
  longlong in_RDX;
  longlong *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  qint64 avail;
  QCborStreamReaderPrivate *self;
  qsizetype total;
  long local_58;
  CborError local_14;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  uVar2 = std::numeric_limits<long_long>::max();
  if ((uVar2 < in_RCX) ||
     (eVar1 = qAddOverflow<long_long>(in_RDX,in_RCX,(longlong *)&local_10), eVar1)) {
    local_14 = CborErrorDataTooLarge;
  }
  else {
    *in_RSI = in_RDX;
    if (*in_RDI == 0) {
      local_58 = QByteArray::size((QByteArray *)(in_RDI + 1));
    }
    else {
      local_58 = (**(code **)(*(long *)*in_RDI + 0xa0))();
    }
    local_14 = CborNoError;
    if (local_58 - in_RDI[0xd] < (long)local_10) {
      local_14 = CborErrorUnexpectedEOF;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_14;
}

Assistant:

static CborError qt_cbor_decoder_transfer_string(void *token, const void **userptr, size_t offset, size_t len)
{
    auto self = static_cast<QCborStreamReaderPrivate *>(token);
    Q_ASSERT(offset <= size_t(self->buffer.size()));
    static_assert(sizeof(size_t) >= sizeof(QByteArray::size_type));
    static_assert(sizeof(size_t) == sizeof(qsizetype));

    // check that we will have enough data from the QIODevice before we advance
    // (otherwise, we'd lose the length information)
    qsizetype total;
    if (len > size_t(std::numeric_limits<QByteArray::size_type>::max())
            || qAddOverflow<qsizetype>(offset, len, &total))
        return CborErrorDataTooLarge;

    // our string transfer is just saving the offset to the userptr
    *userptr = reinterpret_cast<void *>(offset);

    qint64 avail = (self->device ? self->device->bytesAvailable() : self->buffer.size()) -
            self->bufferStart;
    return total > avail ? CborErrorUnexpectedEOF : CborNoError;
}